

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUserDefinedIO.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::tessellation::anon_unknown_1::UserDefinedIOTestInstance::iterate
          (TestStatus *__return_storage_ptr__,UserDefinedIOTestInstance *this)

{
  VkDescriptorPool descriptorPool_00;
  VkDescriptorSet destSet;
  VkRenderPass VVar1;
  VkPipelineLayout pipelineLayout_00;
  VkCommandBuffer commandBuffer;
  VkCommandBuffer_s *pVVar2;
  deUint64 dVar3;
  VkImageSubresourceRange subresourceRange;
  VkImageSubresourceRange subresourceRange_00;
  VkImageSubresourceRange subresourceRange_01;
  RefData<vk::Handle<(vk::HandleType)19>_> data;
  RefData<vk::Handle<(vk::HandleType)21>_> data_00;
  RefData<vk::Handle<(vk::HandleType)22>_> data_01;
  RefData<vk::Handle<(vk::HandleType)13>_> data_02;
  RefData<vk::Handle<(vk::HandleType)17>_> data_03;
  RefData<vk::Handle<(vk::HandleType)23>_> data_04;
  RefData<vk::Handle<(vk::HandleType)16>_> data_05;
  RefData<vk::Handle<(vk::HandleType)24>_> data_06;
  RefData<vk::VkCommandBuffer_s_*> data_07;
  RefData<vk::Handle<(vk::HandleType)18>_> data_08;
  Allocator *pAVar4;
  VkQueue pVVar5;
  VkQueue device_00;
  VkDevice pVVar6;
  bool bVar7;
  deUint32 dVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  deUint32 dVar12;
  deUint32 height;
  InstanceInterface *vki;
  VkPhysicalDevice physDevice;
  TextureFormat format;
  Allocation *pAVar13;
  void *pvVar14;
  VkDeviceMemory VVar15;
  VkDeviceSize VVar16;
  DescriptorSetLayoutBuilder *this_00;
  DescriptorPoolBuilder *this_01;
  Handle<(vk::HandleType)21> *pHVar17;
  Handle<(vk::HandleType)19> *pHVar18;
  VkBuffer *pVVar19;
  Handle<(vk::HandleType)22> *pHVar20;
  DescriptorSetUpdateBuilder *this_02;
  VkImage *pVVar21;
  Handle<(vk::HandleType)17> *pHVar22;
  Handle<(vk::HandleType)13> *pHVar23;
  Handle<(vk::HandleType)24> *pHVar24;
  GraphicsPipelineBuilder *pGVar25;
  ProgramCollection<vk::ProgramBinary> *pPVar26;
  ProgramBinary *pPVar27;
  Handle<(vk::HandleType)16> *pHVar28;
  VkCommandBuffer_s **ppVVar29;
  Handle<(vk::HandleType)23> *pHVar30;
  Handle<(vk::HandleType)18> *pHVar31;
  VkDeviceSize offset;
  TestContext *pTVar32;
  Archive *archive;
  char *fileName;
  TestLog *pTVar33;
  int *piVar34;
  MessageBuilder *pMVar35;
  undefined8 uVar36;
  VkImageSubresourceLayers subresourceLayers;
  VkExtent3D extent;
  int local_162c;
  int local_1628;
  int local_1624;
  allocator<char> local_1171;
  string local_1170;
  byte local_114b;
  byte local_114a;
  allocator<char> local_1149;
  string local_1148;
  allocator<char> local_1121;
  string local_1120;
  string local_1100;
  MessageBuilder local_10e0;
  allocator<char> local_f59;
  string local_f58;
  MessageBuilder local_f38;
  int local_db4;
  uint local_db0;
  int vertexNdx;
  deUint32 numTEInputs;
  int topLevelArraySize;
  TestLog *log;
  string local_d98;
  MessageBuilder local_d78;
  long local_bf8;
  deUint32 *vertices;
  VkDeviceMemory VStack_be8;
  deInt32 numVertices;
  Allocation *local_be0;
  Allocation *resultAlloc;
  TextureFormat local_bb0;
  undefined1 local_ba8 [8];
  ConstPixelBufferAccess resultImageAccess;
  TextureLevel referenceImage;
  Allocation *colorBufferAlloc;
  bool isImageCompareOK;
  undefined1 local_b38 [8];
  VkBufferMemoryBarrier postCopyBarrier;
  undefined1 local_ab0 [8];
  VkBufferImageCopy copyRegion;
  undefined1 local_a58 [8];
  VkImageMemoryBarrier colorAttachmentPreCopyBarrier;
  VkDeviceSize vertexBufferOffset;
  undefined1 local_9e8 [8];
  Vec4 clearColor;
  VkRect2D renderArea;
  undefined1 local_9a8 [8];
  VkImageMemoryBarrier colorAttachmentLayoutBarrier;
  allocator<char> local_949;
  string local_948;
  allocator<char> local_921;
  string local_920;
  allocator<char> local_8f9;
  string local_8f8;
  allocator<char> local_8d1;
  string local_8d0;
  GraphicsPipelineBuilder local_8b0;
  Move<vk::Handle<(vk::HandleType)18>_> local_7a8;
  RefData<vk::Handle<(vk::HandleType)18>_> local_788;
  undefined1 local_768 [8];
  Unique<vk::Handle<(vk::HandleType)18>_> pipeline;
  Move<vk::VkCommandBuffer_s_*> local_740;
  RefData<vk::VkCommandBuffer_s_*> local_720;
  undefined1 local_700 [8];
  Unique<vk::VkCommandBuffer_s_*> cmdBuffer;
  RefData<vk::Handle<(vk::HandleType)24>_> local_6c0;
  undefined1 local_6a0 [8];
  Unique<vk::Handle<(vk::HandleType)24>_> cmdPool;
  Move<vk::Handle<(vk::HandleType)16>_> local_678;
  RefData<vk::Handle<(vk::HandleType)16>_> local_658;
  undefined1 local_638 [8];
  Unique<vk::Handle<(vk::HandleType)16>_> pipelineLayout;
  Move<vk::Handle<(vk::HandleType)23>_> local_608;
  RefData<vk::Handle<(vk::HandleType)23>_> local_5e8;
  undefined1 local_5c8 [8];
  Unique<vk::Handle<(vk::HandleType)23>_> framebuffer;
  RefData<vk::Handle<(vk::HandleType)17>_> local_588;
  undefined1 local_568 [8];
  Unique<vk::Handle<(vk::HandleType)17>_> renderPass;
  Move<vk::Handle<(vk::HandleType)13>_> local_520;
  RefData<vk::Handle<(vk::HandleType)13>_> local_500;
  undefined1 local_4e0 [8];
  Unique<vk::Handle<(vk::HandleType)13>_> colorAttachmentView;
  DescriptorSetUpdateBuilder local_4b0;
  deUint64 local_468;
  undefined1 local_460 [8];
  VkDescriptorBufferInfo resultBufferInfo;
  Move<vk::Handle<(vk::HandleType)22>_> local_438;
  RefData<vk::Handle<(vk::HandleType)22>_> local_418;
  undefined1 local_3f8 [8];
  Unique<vk::Handle<(vk::HandleType)22>_> descriptorSet;
  Move<vk::Handle<(vk::HandleType)21>_> local_3c0;
  RefData<vk::Handle<(vk::HandleType)21>_> local_3a0;
  undefined1 local_380 [8];
  Unique<vk::Handle<(vk::HandleType)21>_> descriptorPool;
  Move<vk::Handle<(vk::HandleType)19>_> local_318;
  RefData<vk::Handle<(vk::HandleType)19>_> local_2f8;
  undefined1 local_2d8 [8];
  Unique<vk::Handle<(vk::HandleType)19>_> descriptorSetLayout;
  VkBufferCreateInfo local_2b0;
  undefined1 local_278 [8];
  Buffer colorBuffer;
  VkDeviceSize colorBufferSizeBytes;
  VkImageCreateInfo local_230;
  undefined1 local_1d8 [8];
  Image colorAttachmentImage;
  VkImageSubresourceRange colorImageSubresourceRange;
  VkFormat colorFormat;
  IVec2 renderSize;
  Allocation *alloc_1;
  VkBufferCreateInfo local_170;
  undefined1 local_138 [8];
  Buffer resultBuffer;
  VkDeviceSize resultBufferSizeBytes;
  int resultBufferMaxVertices;
  Allocation *alloc;
  VkBufferCreateInfo local_d0;
  undefined1 local_98 [8];
  Buffer vertexBuffer;
  VkDeviceSize vertexDataSizeBytes;
  deUint32 vertexStride;
  VkFormat vertexFormat;
  int refNumUniqueVertices;
  int refNumVertices;
  int numAttributes;
  Allocator *allocator;
  VkQueue pVStack_30;
  deUint32 queueFamilyIndex;
  VkQueue queue;
  VkDevice device;
  DeviceInterface *vk;
  UserDefinedIOTestInstance *this_local;
  
  vk = (DeviceInterface *)this;
  this_local = (UserDefinedIOTestInstance *)__return_storage_ptr__;
  vki = Context::getInstanceInterface((this->super_TestInstance).m_context);
  physDevice = Context::getPhysicalDevice((this->super_TestInstance).m_context);
  requireFeatures(vki,physDevice,9);
  device = (VkDevice)Context::getDeviceInterface((this->super_TestInstance).m_context);
  queue = (VkQueue)Context::getDevice((this->super_TestInstance).m_context);
  pVStack_30 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  allocator._4_4_ = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  _refNumVertices = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  refNumUniqueVertices = 10;
  vertexFormat = referenceVertexCount
                           ((this->m_caseDef).primitiveType,SPACINGMODE_EQUAL,false,
                            iterate::attributes,iterate::attributes + 2);
  vertexStride = referenceVertexCount
                           ((this->m_caseDef).primitiveType,SPACINGMODE_EQUAL,true,
                            iterate::attributes,iterate::attributes + 2);
  format = ::vk::mapVkFormat(VK_FORMAT_R32_SFLOAT);
  dVar8 = tcu::getPixelSize(format);
  pVVar6 = device;
  pVVar5 = queue;
  pAVar4 = _refNumVertices;
  vertexBuffer.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
  m_data._8_8_ = ZEXT48(dVar8 * 10);
  makeBufferCreateInfo
            (&local_d0,
             vertexBuffer.m_allocation.
             super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._8_8_,0x80
            );
  tessellation::Buffer::Buffer
            ((Buffer *)local_98,(DeviceInterface *)pVVar6,(VkDevice)pVVar5,pAVar4,&local_d0,
             ::vk::MemoryRequirement::HostVisible);
  pAVar13 = tessellation::Buffer::getAllocation((Buffer *)local_98);
  pvVar14 = ::vk::Allocation::getHostPtr(pAVar13);
  ::deMemcpy(pvVar14,iterate::attributes,
             vertexBuffer.m_allocation.
             super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._8_8_);
  pVVar6 = device;
  pVVar5 = queue;
  VVar15 = ::vk::Allocation::getMemory(pAVar13);
  VVar16 = ::vk::Allocation::getOffset(pAVar13);
  ::vk::flushMappedMemoryRange
            ((DeviceInterface *)pVVar6,(VkDevice)pVVar5,VVar15,VVar16,
             vertexBuffer.m_allocation.
             super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._8_8_);
  pVVar6 = device;
  pVVar5 = queue;
  pAVar4 = _refNumVertices;
  resultBuffer.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
  m_data._8_8_ = (long)(int)vertexFormat * 4 + 4;
  makeBufferCreateInfo
            (&local_170,
             resultBuffer.m_allocation.
             super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._8_8_,0x20
            );
  tessellation::Buffer::Buffer
            ((Buffer *)local_138,(DeviceInterface *)pVVar6,(VkDevice)pVVar5,pAVar4,&local_170,
             ::vk::MemoryRequirement::HostVisible);
  pAVar13 = tessellation::Buffer::getAllocation((Buffer *)local_138);
  pvVar14 = ::vk::Allocation::getHostPtr(pAVar13);
  ::deMemset(pvVar14,0,
             resultBuffer.m_allocation.
             super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._8_8_);
  pVVar6 = device;
  pVVar5 = queue;
  VVar15 = ::vk::Allocation::getMemory(pAVar13);
  VVar16 = ::vk::Allocation::getOffset(pAVar13);
  ::vk::flushMappedMemoryRange
            ((DeviceInterface *)pVVar6,(VkDevice)pVVar5,VVar15,VVar16,
             resultBuffer.m_allocation.
             super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._8_8_);
  tcu::Vector<int,_2>::Vector((Vector<int,_2> *)&colorImageSubresourceRange.layerCount,0x100,0x100);
  colorImageSubresourceRange.baseArrayLayer = 0x25;
  ::vk::makeImageSubresourceRange
            ((VkImageSubresourceRange *)
             &colorAttachmentImage.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.field_0x8
             ,1,0,1,0,1);
  pVVar6 = device;
  pVVar5 = queue;
  pAVar4 = _refNumVertices;
  makeImageCreateInfo(&local_230,(IVec2 *)&colorImageSubresourceRange.layerCount,
                      VK_FORMAT_R8G8B8A8_UNORM,0x11,1);
  tessellation::Image::Image
            ((Image *)local_1d8,(DeviceInterface *)pVVar6,(VkDevice)pVVar5,pAVar4,&local_230,
             ::vk::MemoryRequirement::Any);
  iVar9 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&colorImageSubresourceRange.layerCount);
  iVar10 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&colorImageSubresourceRange.layerCount);
  colorBuffer.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
  m_data._8_8_ = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  iVar11 = tcu::getPixelSize((TextureFormat)
                             colorBuffer.m_allocation.
                             super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                             m_data._8_8_);
  pVVar6 = device;
  pVVar5 = queue;
  pAVar4 = _refNumVertices;
  VVar16 = (VkDeviceSize)(iVar9 * iVar10 * iVar11);
  makeBufferCreateInfo(&local_2b0,VVar16,2);
  descriptorSetLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator.
  _4_4_ = ::vk::MemoryRequirement::HostVisible.m_flags;
  tessellation::Buffer::Buffer
            ((Buffer *)local_278,(DeviceInterface *)pVVar6,(VkDevice)pVVar5,pAVar4,&local_2b0,
             ::vk::MemoryRequirement::HostVisible);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)
             &descriptorPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
              m_allocator);
  this_00 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                      ((DescriptorSetLayoutBuilder *)
                       &descriptorPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter
                        .m_allocator,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,4);
  ::vk::DescriptorSetLayoutBuilder::build
            (&local_318,this_00,(DeviceInterface *)device,(VkDevice)queue,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_2f8,(Move *)&local_318);
  data.deleter.m_deviceIface._0_4_ = (int)local_2f8.deleter.m_deviceIface;
  data.object.m_internal = local_2f8.object.m_internal;
  data.deleter.m_deviceIface._4_4_ = (int)((ulong)local_2f8.deleter.m_deviceIface >> 0x20);
  data.deleter.m_device._0_4_ = (int)local_2f8.deleter.m_device;
  data.deleter.m_device._4_4_ = (int)((ulong)local_2f8.deleter.m_device >> 0x20);
  data.deleter.m_allocator._0_4_ = (int)local_2f8.deleter.m_allocator;
  data.deleter.m_allocator._4_4_ = (int)((ulong)local_2f8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)19>_> *)local_2d8,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::~Move(&local_318);
  ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)
             &descriptorPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
              m_allocator);
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder
            ((DescriptorPoolBuilder *)
             &descriptorSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool);
  this_01 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)
                       &descriptorSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
                        m_pool,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1);
  ::vk::DescriptorPoolBuilder::build
            (&local_3c0,this_01,(DeviceInterface *)device,(VkDevice)queue,1,1);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_3a0,(Move *)&local_3c0);
  data_00.deleter.m_deviceIface._0_4_ = (int)local_3a0.deleter.m_deviceIface;
  data_00.object.m_internal = local_3a0.object.m_internal;
  data_00.deleter.m_deviceIface._4_4_ = (int)((ulong)local_3a0.deleter.m_deviceIface >> 0x20);
  data_00.deleter.m_device._0_4_ = (int)local_3a0.deleter.m_device;
  data_00.deleter.m_device._4_4_ = (int)((ulong)local_3a0.deleter.m_device >> 0x20);
  data_00.deleter.m_allocator._0_4_ = (int)local_3a0.deleter.m_allocator;
  data_00.deleter.m_allocator._4_4_ = (int)((ulong)local_3a0.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)21>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)21>_> *)local_380,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::~Move(&local_3c0);
  ::vk::DescriptorPoolBuilder::~DescriptorPoolBuilder
            ((DescriptorPoolBuilder *)
             &descriptorSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool);
  pVVar6 = device;
  pVVar5 = queue;
  pHVar17 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)21>_> *)local_380);
  descriptorPool_00.m_internal = pHVar17->m_internal;
  pHVar18 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)19>_> *)local_2d8);
  resultBufferInfo.range = pHVar18->m_internal;
  makeDescriptorSet(&local_438,(DeviceInterface *)pVVar6,(VkDevice)pVVar5,descriptorPool_00,
                    (VkDescriptorSetLayout)resultBufferInfo.range);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_418,(Move *)&local_438);
  data_01.deleter.m_deviceIface._0_4_ = (int)local_418.deleter.m_deviceIface;
  data_01.object.m_internal = local_418.object.m_internal;
  data_01.deleter.m_deviceIface._4_4_ = (int)((ulong)local_418.deleter.m_deviceIface >> 0x20);
  data_01.deleter.m_device._0_4_ = (int)local_418.deleter.m_device;
  data_01.deleter.m_device._4_4_ = (int)((ulong)local_418.deleter.m_device >> 0x20);
  data_01.deleter.m_pool.m_internal._0_4_ = (int)local_418.deleter.m_pool.m_internal;
  data_01.deleter.m_pool.m_internal._4_4_ = (int)(local_418.deleter.m_pool.m_internal >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)22>_> *)local_3f8,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::~Move(&local_438);
  pVVar19 = tessellation::Buffer::get((Buffer *)local_138);
  local_468 = pVVar19->m_internal;
  ::vk::makeDescriptorBufferInfo
            ((VkDescriptorBufferInfo *)local_460,(VkBuffer)local_468,0,
             resultBuffer.m_allocation.
             super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._8_8_);
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder(&local_4b0);
  pHVar20 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)22>_> *)local_3f8);
  destSet.m_internal = pHVar20->m_internal;
  colorAttachmentView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)::vk::DescriptorSetUpdateBuilder::Location::binding(0);
  this_02 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                      (&local_4b0,destSet,
                       (Location *)
                       &colorAttachmentView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.
                        deleter.m_allocator,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,
                       (VkDescriptorBufferInfo *)local_460);
  ::vk::DescriptorSetUpdateBuilder::update(this_02,(DeviceInterface *)device,(VkDevice)queue);
  ::vk::DescriptorSetUpdateBuilder::~DescriptorSetUpdateBuilder(&local_4b0);
  pVVar6 = device;
  pVVar5 = queue;
  pVVar21 = tessellation::Image::operator*((Image *)local_1d8);
  renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)
       colorAttachmentImage.m_allocation.
       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._8_8_;
  subresourceRange.levelCount = colorImageSubresourceRange.aspectMask;
  subresourceRange.aspectMask =
       colorAttachmentImage.m_allocation.
       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._8_4_;
  subresourceRange.baseMipLevel =
       colorAttachmentImage.m_allocation.
       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._12_4_;
  subresourceRange.baseArrayLayer = colorImageSubresourceRange.baseMipLevel;
  subresourceRange.layerCount = colorImageSubresourceRange.levelCount;
  makeImageView(&local_520,(DeviceInterface *)pVVar6,(VkDevice)pVVar5,(VkImage)pVVar21->m_internal,
                VK_IMAGE_VIEW_TYPE_2D,VK_FORMAT_R8G8B8A8_UNORM,subresourceRange);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_500,(Move *)&local_520);
  data_02.deleter.m_deviceIface._0_4_ = (int)local_500.deleter.m_deviceIface;
  data_02.object.m_internal = local_500.object.m_internal;
  data_02.deleter.m_deviceIface._4_4_ = (int)((ulong)local_500.deleter.m_deviceIface >> 0x20);
  data_02.deleter.m_device._0_4_ = (int)local_500.deleter.m_device;
  data_02.deleter.m_device._4_4_ = (int)((ulong)local_500.deleter.m_device >> 0x20);
  data_02.deleter.m_allocator._0_4_ = (int)local_500.deleter.m_allocator;
  data_02.deleter.m_allocator._4_4_ = (int)((ulong)local_500.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)13>_> *)local_4e0,data_02);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::~Move(&local_520);
  makeRenderPass((Move<vk::Handle<(vk::HandleType)17>_> *)
                 &framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.
                  m_allocator,(DeviceInterface *)device,(VkDevice)queue,VK_FORMAT_R8G8B8A8_UNORM);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_588,
             (Move *)&framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.
                      m_allocator);
  data_03.deleter.m_deviceIface._0_4_ = (int)local_588.deleter.m_deviceIface;
  data_03.object.m_internal = local_588.object.m_internal;
  data_03.deleter.m_deviceIface._4_4_ = (int)((ulong)local_588.deleter.m_deviceIface >> 0x20);
  data_03.deleter.m_device._0_4_ = (int)local_588.deleter.m_device;
  data_03.deleter.m_device._4_4_ = (int)((ulong)local_588.deleter.m_device >> 0x20);
  data_03.deleter.m_allocator._0_4_ = (int)local_588.deleter.m_allocator;
  data_03.deleter.m_allocator._4_4_ = (int)((ulong)local_588.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)17>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)17>_> *)local_568,data_03);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)17>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)17>_> *)
             &framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator)
  ;
  pVVar6 = device;
  pVVar5 = queue;
  pHVar22 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)17>_> *)local_568);
  VVar1.m_internal = pHVar22->m_internal;
  pHVar23 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)13>_> *)local_4e0);
  pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pHVar23->m_internal;
  dVar12 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&colorImageSubresourceRange.layerCount);
  height = tcu::Vector<int,_2>::y((Vector<int,_2> *)&colorImageSubresourceRange.layerCount);
  makeFramebuffer(&local_608,(DeviceInterface *)pVVar6,(VkDevice)pVVar5,VVar1,
                  (VkImageView)
                  pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
                  m_allocator,dVar12,height,1);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_5e8,(Move *)&local_608);
  data_04.deleter.m_deviceIface._0_4_ = (int)local_5e8.deleter.m_deviceIface;
  data_04.object.m_internal = local_5e8.object.m_internal;
  data_04.deleter.m_deviceIface._4_4_ = (int)((ulong)local_5e8.deleter.m_deviceIface >> 0x20);
  data_04.deleter.m_device._0_4_ = (int)local_5e8.deleter.m_device;
  data_04.deleter.m_device._4_4_ = (int)((ulong)local_5e8.deleter.m_device >> 0x20);
  data_04.deleter.m_allocator._0_4_ = (int)local_5e8.deleter.m_allocator;
  data_04.deleter.m_allocator._4_4_ = (int)((ulong)local_5e8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)23>_> *)local_5c8,data_04);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::~Move(&local_608);
  pVVar6 = device;
  pVVar5 = queue;
  pHVar18 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)19>_> *)local_2d8);
  cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pHVar18->m_internal;
  makePipelineLayout(&local_678,(DeviceInterface *)pVVar6,(VkDevice)pVVar5,
                     (VkDescriptorSetLayout)
                     cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
                     m_allocator);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_658,(Move *)&local_678);
  data_05.deleter.m_deviceIface._0_4_ = (int)local_658.deleter.m_deviceIface;
  data_05.object.m_internal = local_658.object.m_internal;
  data_05.deleter.m_deviceIface._4_4_ = (int)((ulong)local_658.deleter.m_deviceIface >> 0x20);
  data_05.deleter.m_device._0_4_ = (int)local_658.deleter.m_device;
  data_05.deleter.m_device._4_4_ = (int)((ulong)local_658.deleter.m_device >> 0x20);
  data_05.deleter.m_allocator._0_4_ = (int)local_658.deleter.m_allocator;
  data_05.deleter.m_allocator._4_4_ = (int)((ulong)local_658.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_638,data_05);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::~Move(&local_678);
  makeCommandPool((Move<vk::Handle<(vk::HandleType)24>_> *)
                  &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool,
                  (DeviceInterface *)device,(VkDevice)queue,allocator._4_4_);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_6c0,
             (Move *)&cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  data_06.deleter.m_deviceIface._0_4_ = (int)local_6c0.deleter.m_deviceIface;
  data_06.object.m_internal = local_6c0.object.m_internal;
  data_06.deleter.m_deviceIface._4_4_ = (int)((ulong)local_6c0.deleter.m_deviceIface >> 0x20);
  data_06.deleter.m_device._0_4_ = (int)local_6c0.deleter.m_device;
  data_06.deleter.m_device._4_4_ = (int)((ulong)local_6c0.deleter.m_device >> 0x20);
  data_06.deleter.m_allocator._0_4_ = (int)local_6c0.deleter.m_allocator;
  data_06.deleter.m_allocator._4_4_ = (int)((ulong)local_6c0.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_6a0,data_06);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)24>_> *)
             &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  pVVar6 = device;
  pVVar5 = queue;
  pHVar24 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_6a0);
  pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pHVar24->m_internal;
  ::vk::allocateCommandBuffer
            (&local_740,(DeviceInterface *)pVVar6,(VkDevice)pVVar5,
             (VkCommandPool)
             pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator,
             VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_720,(Move *)&local_740);
  data_07.deleter.m_deviceIface._0_4_ = (int)local_720.deleter.m_deviceIface;
  data_07.object = local_720.object;
  data_07.deleter.m_deviceIface._4_4_ = (int)((ulong)local_720.deleter.m_deviceIface >> 0x20);
  data_07.deleter.m_device._0_4_ = (int)local_720.deleter.m_device;
  data_07.deleter.m_device._4_4_ = (int)((ulong)local_720.deleter.m_device >> 0x20);
  data_07.deleter.m_pool.m_internal._0_4_ = (int)local_720.deleter.m_pool.m_internal;
  data_07.deleter.m_pool.m_internal._4_4_ = (int)(local_720.deleter.m_pool.m_internal >> 0x20);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_700,data_07);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&local_740);
  GraphicsPipelineBuilder::GraphicsPipelineBuilder(&local_8b0);
  pGVar25 = GraphicsPipelineBuilder::setRenderSize
                      (&local_8b0,(IVec2 *)&colorImageSubresourceRange.layerCount);
  pGVar25 = GraphicsPipelineBuilder::setPatchControlPoints(pGVar25,10);
  pGVar25 = GraphicsPipelineBuilder::setVertexInputSingleAttribute
                      (pGVar25,VK_FORMAT_R32_SFLOAT,dVar8);
  pVVar6 = device;
  pVVar5 = queue;
  pPVar26 = Context::getBinaryCollection((this->super_TestInstance).m_context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8d0,"vert",&local_8d1);
  pPVar27 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar26,&local_8d0);
  pGVar25 = GraphicsPipelineBuilder::setShader
                      (pGVar25,(DeviceInterface *)pVVar6,(VkDevice)pVVar5,VK_SHADER_STAGE_VERTEX_BIT
                       ,pPVar27,(VkSpecializationInfo *)0x0);
  pVVar6 = device;
  pVVar5 = queue;
  pPVar26 = Context::getBinaryCollection((this->super_TestInstance).m_context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8f8,"tesc",&local_8f9);
  pPVar27 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar26,&local_8f8);
  pGVar25 = GraphicsPipelineBuilder::setShader
                      (pGVar25,(DeviceInterface *)pVVar6,(VkDevice)pVVar5,
                       VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,pPVar27,(VkSpecializationInfo *)0x0)
  ;
  pVVar6 = device;
  pVVar5 = queue;
  pPVar26 = Context::getBinaryCollection((this->super_TestInstance).m_context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_920,"tese",&local_921);
  pPVar27 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar26,&local_920);
  pGVar25 = GraphicsPipelineBuilder::setShader
                      (pGVar25,(DeviceInterface *)pVVar6,(VkDevice)pVVar5,
                       VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT,pPVar27,
                       (VkSpecializationInfo *)0x0);
  pVVar6 = device;
  pVVar5 = queue;
  pPVar26 = Context::getBinaryCollection((this->super_TestInstance).m_context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_948,"frag",&local_949);
  pPVar27 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar26,&local_948);
  pGVar25 = GraphicsPipelineBuilder::setShader
                      (pGVar25,(DeviceInterface *)pVVar6,(VkDevice)pVVar5,
                       VK_SHADER_STAGE_FRAGMENT_BIT,pPVar27,(VkSpecializationInfo *)0x0);
  pVVar6 = device;
  pVVar5 = queue;
  pHVar28 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)16>_> *)local_638);
  pipelineLayout_00.m_internal = pHVar28->m_internal;
  pHVar22 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)17>_> *)local_568);
  colorAttachmentLayoutBarrier._64_8_ = pHVar22->m_internal;
  GraphicsPipelineBuilder::build
            (&local_7a8,pGVar25,(DeviceInterface *)pVVar6,(VkDevice)pVVar5,pipelineLayout_00,
             (VkRenderPass)colorAttachmentLayoutBarrier._64_8_);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_788,(Move *)&local_7a8);
  data_08.deleter.m_deviceIface._0_4_ = (int)local_788.deleter.m_deviceIface;
  data_08.object.m_internal = local_788.object.m_internal;
  data_08.deleter.m_deviceIface._4_4_ = (int)((ulong)local_788.deleter.m_deviceIface >> 0x20);
  data_08.deleter.m_device._0_4_ = (int)local_788.deleter.m_device;
  data_08.deleter.m_device._4_4_ = (int)((ulong)local_788.deleter.m_device >> 0x20);
  data_08.deleter.m_allocator._0_4_ = (int)local_788.deleter.m_allocator;
  data_08.deleter.m_allocator._4_4_ = (int)((ulong)local_788.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_768,data_08);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move(&local_7a8);
  std::__cxx11::string::~string((string *)&local_948);
  std::allocator<char>::~allocator(&local_949);
  std::__cxx11::string::~string((string *)&local_920);
  std::allocator<char>::~allocator(&local_921);
  std::__cxx11::string::~string((string *)&local_8f8);
  std::allocator<char>::~allocator(&local_8f9);
  std::__cxx11::string::~string((string *)&local_8d0);
  std::allocator<char>::~allocator(&local_8d1);
  GraphicsPipelineBuilder::~GraphicsPipelineBuilder(&local_8b0);
  pVVar6 = device;
  ppVVar29 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_700);
  beginCommandBuffer((DeviceInterface *)pVVar6,*ppVVar29);
  pVVar21 = tessellation::Image::operator*((Image *)local_1d8);
  subresourceRange_00.levelCount = colorImageSubresourceRange.aspectMask;
  subresourceRange_00.aspectMask =
       colorAttachmentImage.m_allocation.
       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._8_4_;
  subresourceRange_00.baseMipLevel =
       colorAttachmentImage.m_allocation.
       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._12_4_;
  subresourceRange_00.baseArrayLayer = colorImageSubresourceRange.baseMipLevel;
  subresourceRange_00.layerCount = colorImageSubresourceRange.levelCount;
  makeImageMemoryBarrier
            ((VkImageMemoryBarrier *)local_9a8,0,0x100,VK_IMAGE_LAYOUT_UNDEFINED,
             VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,(VkImage)pVVar21->m_internal,
             subresourceRange_00);
  pVVar6 = device;
  ppVVar29 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_700);
  (**(code **)(*(long *)pVVar6 + 0x368))(pVVar6,*ppVVar29,1,0x80,0,0,0,0,0,1,local_9a8);
  clearColor.m_data._8_8_ = ::vk::makeOffset2D(0,0);
  dVar8 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&colorImageSubresourceRange.layerCount);
  dVar12 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&colorImageSubresourceRange.layerCount);
  ::vk::makeExtent2D(dVar8,dVar12);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_9e8,0.0,0.0,0.0,1.0);
  pVVar6 = device;
  ppVVar29 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_700);
  commandBuffer = *ppVVar29;
  pHVar22 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)17>_> *)local_568);
  VVar1.m_internal = pHVar22->m_internal;
  pHVar30 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)23>_> *)local_5c8);
  beginRenderPass((DeviceInterface *)pVVar6,commandBuffer,VVar1,(VkFramebuffer)pHVar30->m_internal,
                  (VkRect2D *)(clearColor.m_data + 2),(Vec4 *)local_9e8);
  pVVar6 = device;
  ppVVar29 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_700);
  pVVar2 = *ppVVar29;
  pHVar31 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)18>_> *)local_768);
  (**(code **)(*(long *)pVVar6 + 0x260))(pVVar6,pVVar2,0,pHVar31->m_internal);
  pVVar6 = device;
  ppVVar29 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_700);
  pVVar2 = *ppVVar29;
  pHVar28 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)16>_> *)local_638);
  dVar3 = pHVar28->m_internal;
  pHVar20 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::get
                      ((RefBase<vk::Handle<(vk::HandleType)22>_> *)local_3f8);
  (**(code **)(*(long *)pVVar6 + 0x2b0))(pVVar6,pVVar2,0,dVar3,0,1,(int)pHVar20,0,0);
  pVVar6 = device;
  colorAttachmentPreCopyBarrier.subresourceRange.layerCount = 0;
  colorAttachmentPreCopyBarrier._68_4_ = 0;
  ppVVar29 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_700);
  pVVar2 = *ppVVar29;
  pVVar19 = tessellation::Buffer::get((Buffer *)local_98);
  (**(code **)(*(long *)pVVar6 + 0x2c0))
            (pVVar6,pVVar2,0,1,pVVar19,&colorAttachmentPreCopyBarrier.subresourceRange.layerCount);
  pVVar6 = device;
  ppVVar29 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_700);
  (**(code **)(*(long *)pVVar6 + 0x2c8))(pVVar6,*ppVVar29,10,1,0);
  pVVar6 = device;
  ppVVar29 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_700);
  endRenderPass((DeviceInterface *)pVVar6,*ppVVar29);
  pVVar21 = tessellation::Image::operator*((Image *)local_1d8);
  copyRegion.imageExtent.height =
       colorAttachmentImage.m_allocation.
       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._8_4_;
  copyRegion.imageExtent.depth =
       colorAttachmentImage.m_allocation.
       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._12_4_;
  subresourceRange_01.levelCount = colorImageSubresourceRange.aspectMask;
  subresourceRange_01.aspectMask =
       colorAttachmentImage.m_allocation.
       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._8_4_;
  subresourceRange_01.baseMipLevel =
       colorAttachmentImage.m_allocation.
       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._12_4_;
  subresourceRange_01.baseArrayLayer = colorImageSubresourceRange.baseMipLevel;
  subresourceRange_01.layerCount = colorImageSubresourceRange.levelCount;
  makeImageMemoryBarrier
            ((VkImageMemoryBarrier *)local_a58,0x100,0x800,VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
             VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,(VkImage)pVVar21->m_internal,subresourceRange_01);
  pVVar6 = device;
  ppVVar29 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_700);
  (**(code **)(*(long *)pVVar6 + 0x368))(pVVar6,*ppVVar29,0x400,0x1000,0,0,0,0,0,1,local_a58);
  dVar8 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&colorImageSubresourceRange.layerCount);
  dVar12 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&colorImageSubresourceRange.layerCount);
  extent = ::vk::makeExtent3D(dVar8,dVar12,1);
  subresourceLayers = ::vk::makeImageSubresourceLayers(1,0,0,1);
  makeBufferImageCopy((VkBufferImageCopy *)local_ab0,extent,subresourceLayers);
  pVVar6 = device;
  ppVVar29 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_700);
  pVVar2 = *ppVVar29;
  pVVar21 = tessellation::Image::operator*((Image *)local_1d8);
  dVar3 = pVVar21->m_internal;
  pVVar19 = tessellation::Buffer::operator*((Buffer *)local_278);
  postCopyBarrier.size = pVVar19->m_internal;
  (**(code **)(*(long *)pVVar6 + 0x318))
            (pVVar6,pVVar2,dVar3,6,postCopyBarrier.size,1,(int)local_ab0);
  pVVar19 = tessellation::Buffer::operator*((Buffer *)local_278);
  makeBufferMemoryBarrier
            ((VkBufferMemoryBarrier *)local_b38,0x1000,0x2000,(VkBuffer)pVVar19->m_internal,0,VVar16
            );
  pVVar6 = device;
  ppVVar29 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_700);
  (**(code **)(*(long *)pVVar6 + 0x368))(pVVar6,*ppVVar29,0x1000,0x4000,0,0,0,1,(int)local_b38,0,0);
  pVVar6 = device;
  ppVVar29 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_700);
  endCommandBuffer((DeviceInterface *)pVVar6,*ppVVar29);
  pVVar6 = device;
  device_00 = queue;
  pVVar5 = pVStack_30;
  ppVVar29 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_700);
  submitCommandsAndWait((DeviceInterface *)pVVar6,(VkDevice)device_00,pVVar5,*ppVVar29);
  pAVar13 = tessellation::Buffer::getAllocation((Buffer *)local_278);
  pVVar6 = device;
  pVVar5 = queue;
  VVar15 = ::vk::Allocation::getMemory(pAVar13);
  offset = ::vk::Allocation::getOffset(pAVar13);
  ::vk::invalidateMappedMemoryRange((DeviceInterface *)pVVar6,(VkDevice)pVVar5,VVar15,offset,VVar16)
  ;
  tcu::TextureLevel::TextureLevel((TextureLevel *)&resultImageAccess.m_data);
  pTVar32 = Context::getTestContext((this->super_TestInstance).m_context);
  archive = tcu::TestContext::getArchive(pTVar32);
  fileName = (char *)std::__cxx11::string::c_str();
  tcu::ImageIO::loadPNG((TextureLevel *)&resultImageAccess.m_data,archive,fileName);
  local_bb0 = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  iVar9 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&colorImageSubresourceRange.layerCount);
  iVar10 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&colorImageSubresourceRange.layerCount);
  pvVar14 = ::vk::Allocation::getHostPtr(pAVar13);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            ((ConstPixelBufferAccess *)local_ba8,&local_bb0,iVar9,iVar10,1,pvVar14);
  pTVar32 = Context::getTestContext((this->super_TestInstance).m_context);
  pTVar33 = tcu::TestContext::getLog(pTVar32);
  tcu::TextureLevel::getAccess
            ((PixelBufferAccess *)&resultAlloc,(TextureLevel *)&resultImageAccess.m_data);
  bVar7 = tcu::fuzzyCompare(pTVar33,"ImageComparison","Image Comparison",
                            (ConstPixelBufferAccess *)&resultAlloc,
                            (ConstPixelBufferAccess *)local_ba8,0.02,COMPARE_LOG_RESULT);
  tcu::TextureLevel::~TextureLevel((TextureLevel *)&resultImageAccess.m_data);
  local_be0 = tessellation::Buffer::getAllocation((Buffer *)local_138);
  pVVar6 = device;
  pVVar5 = queue;
  VStack_be8 = ::vk::Allocation::getMemory(local_be0);
  VVar16 = ::vk::Allocation::getOffset(local_be0);
  uVar36 = resultBuffer.m_allocation.
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._8_8_;
  ::vk::invalidateMappedMemoryRange
            ((DeviceInterface *)pVVar6,(VkDevice)pVVar5,VStack_be8,VVar16,
             resultBuffer.m_allocation.
             super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._8_8_);
  iVar9 = (int)uVar36;
  piVar34 = (int *)::vk::Allocation::getHostPtr(local_be0);
  vertices._4_4_ = *piVar34;
  pvVar14 = ::vk::Allocation::getHostPtr(local_be0);
  local_bf8 = (long)pvVar14 + 4;
  if (vertices._4_4_ < (int)vertexStride) {
    pTVar32 = Context::getTestContext((this->super_TestInstance).m_context);
    pTVar33 = tcu::TestContext::getLog(pTVar32);
    tcu::TestLog::operator<<(&local_d78,pTVar33,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar35 = tcu::MessageBuilder::operator<<(&local_d78,(char (*) [14])"Failure: got ");
    pMVar35 = tcu::MessageBuilder::operator<<(pMVar35,(int *)((long)&vertices + 4));
    pMVar35 = tcu::MessageBuilder::operator<<
                        (pMVar35,(char (*) [34])" vertices, but expected at least ");
    pMVar35 = tcu::MessageBuilder::operator<<(pMVar35,(int *)&vertexStride);
    tcu::MessageBuilder::operator<<(pMVar35,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_d78);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d98,"Wrong number of vertices",(allocator<char> *)((long)&log + 7));
    tcu::TestStatus::fail(__return_storage_ptr__,&local_d98);
    std::__cxx11::string::~string((string *)&local_d98);
    std::allocator<char>::~allocator((allocator<char> *)((long)&log + 7));
  }
  else {
    pTVar32 = Context::getTestContext((this->super_TestInstance).m_context);
    _numTEInputs = tcu::TestContext::getLog(pTVar32);
    if ((this->m_caseDef).ioType == IO_TYPE_PER_PATCH) {
      local_1624 = 1;
    }
    else {
      if ((this->m_caseDef).ioType == IO_TYPE_PER_PATCH_ARRAY) {
        local_1628 = 3;
      }
      else {
        if ((this->m_caseDef).ioType == IO_TYPE_PER_PATCH_BLOCK) {
          local_162c = 1;
        }
        else {
          local_162c = 5;
          if ((this->m_caseDef).ioType == IO_TYPE_PER_PATCH_BLOCK_ARRAY) {
            local_162c = 2;
          }
        }
        local_1628 = local_162c;
      }
      local_1624 = local_1628;
    }
    vertexNdx = local_1624;
    iVar10 = numBasicSubobjectsInElementType(&this->m_tesInputs);
    local_db0 = iVar10 * vertexNdx;
    for (local_db4 = 0; local_db4 < vertices._4_4_; local_db4 = local_db4 + 1) {
      if (local_db0 < *(uint *)(local_bf8 + (long)local_db4 * 4)) {
        tcu::TestLog::operator<<
                  (&local_f38,_numTEInputs,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar35 = tcu::MessageBuilder::operator<<
                            (&local_f38,
                             (char (*) [49])"Failure: out_te_firstFailedInputIndex has value ");
        pMVar35 = tcu::MessageBuilder::operator<<(pMVar35,(uint *)(local_bf8 + (long)local_db4 * 4))
        ;
        pMVar35 = tcu::MessageBuilder::operator<<
                            (pMVar35,(char (*) [30])", but should be in range [0, ");
        pMVar35 = tcu::MessageBuilder::operator<<(pMVar35,&local_db0);
        pMVar35 = tcu::MessageBuilder::operator<<(pMVar35,(char (*) [2])0x12d726b);
        tcu::MessageBuilder::operator<<(pMVar35,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_f38);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f58,"Invalid values returned from shader",&local_f59);
        tcu::TestStatus::fail(__return_storage_ptr__,&local_f58);
        std::__cxx11::string::~string((string *)&local_f58);
        std::allocator<char>::~allocator(&local_f59);
        goto LAB_00df504c;
      }
      if (*(uint *)(local_bf8 + (long)local_db4 * 4) != local_db0) {
        tcu::TestLog::operator<<
                  (&local_10e0,_numTEInputs,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar35 = tcu::MessageBuilder::operator<<
                            (&local_10e0,
                             (char (*) [61])
                             "Failure: in tessellation evaluation shader, check for input ");
        tessellation::(anonymous_namespace)::basicSubobjectAtIndex_abi_cxx11_
                  (&local_1100,
                   (_anonymous_namespace_ *)(ulong)*(uint *)(local_bf8 + (long)local_db4 * 4),
                   (int)this + 0x40,
                   (vector<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>,_std::allocator<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>_>_>
                    *)(ulong)(uint)vertexNdx,iVar9);
        pMVar35 = tcu::MessageBuilder::operator<<(pMVar35,&local_1100);
        pMVar35 = tcu::MessageBuilder::operator<<(pMVar35,(char (*) [8])0x1378540);
        tcu::MessageBuilder::operator<<(pMVar35,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::string::~string((string *)&local_1100);
        tcu::MessageBuilder::~MessageBuilder(&local_10e0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1120,"Invalid input value in tessellation evaluation shader",
                   &local_1121);
        tcu::TestStatus::fail(__return_storage_ptr__,&local_1120);
        std::__cxx11::string::~string((string *)&local_1120);
        std::allocator<char>::~allocator(&local_1121);
        goto LAB_00df504c;
      }
    }
    local_114a = 0;
    local_114b = 0;
    if (bVar7) {
      std::allocator<char>::allocator();
      local_114a = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1148,"OK",&local_1149);
      local_114b = 1;
      tcu::TestStatus::pass(__return_storage_ptr__,&local_1148);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1170,"Image comparison failed",&local_1171);
      tcu::TestStatus::fail(__return_storage_ptr__,&local_1170);
      std::__cxx11::string::~string((string *)&local_1170);
      std::allocator<char>::~allocator(&local_1171);
    }
    if ((local_114b & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_1148);
    }
    if ((local_114a & 1) != 0) {
      std::allocator<char>::~allocator(&local_1149);
    }
  }
LAB_00df504c:
  log._0_4_ = 1;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_768);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::~Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_700);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_6a0);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_638);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)23>_> *)local_5c8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)17>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)17>_> *)local_568);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)13>_> *)local_4e0);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)22>_> *)local_3f8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)21>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)21>_> *)local_380);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)19>_> *)local_2d8);
  tessellation::Buffer::~Buffer((Buffer *)local_278);
  tessellation::Image::~Image((Image *)local_1d8);
  tessellation::Buffer::~Buffer((Buffer *)local_138);
  tessellation::Buffer::~Buffer((Buffer *)local_98);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus UserDefinedIOTestInstance::iterate (void)
{
	requireFeatures(m_context.getInstanceInterface(), m_context.getPhysicalDevice(), FEATURE_TESSELLATION_SHADER | FEATURE_VERTEX_PIPELINE_STORES_AND_ATOMICS);

	const DeviceInterface&	vk					= m_context.getDeviceInterface();
	const VkDevice			device				= m_context.getDevice();
	const VkQueue			queue				= m_context.getUniversalQueue();
	const deUint32			queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();
	Allocator&				allocator			= m_context.getDefaultAllocator();

	const int				numAttributes				= NUM_TESS_LEVELS + 2 + 2;
	static const float		attributes[numAttributes]	= { /* inner */ 3.0f, 4.0f, /* outer */ 5.0f, 6.0f, 7.0f, 8.0f, /* pos. scale */ 1.2f, 1.3f, /* pos. offset */ -0.3f, -0.4f };
	const int				refNumVertices				= referenceVertexCount(m_caseDef.primitiveType, SPACINGMODE_EQUAL, false, &attributes[0], &attributes[2]);
	const int				refNumUniqueVertices		= referenceVertexCount(m_caseDef.primitiveType, SPACINGMODE_EQUAL, true, &attributes[0], &attributes[2]);

	// Vertex input attributes buffer: to pass tessellation levels

	const VkFormat     vertexFormat				= VK_FORMAT_R32_SFLOAT;
	const deUint32     vertexStride				= tcu::getPixelSize(mapVkFormat(vertexFormat));
	const VkDeviceSize vertexDataSizeBytes		= numAttributes * vertexStride;
	const Buffer       vertexBuffer				(vk, device, allocator, makeBufferCreateInfo(vertexDataSizeBytes, VK_BUFFER_USAGE_VERTEX_BUFFER_BIT), MemoryRequirement::HostVisible);

	{
		const Allocation& alloc = vertexBuffer.getAllocation();
		deMemcpy(alloc.getHostPtr(), &attributes[0], static_cast<std::size_t>(vertexDataSizeBytes));
		flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), vertexDataSizeBytes);
	}

	// Output buffer: number of invocations and verification indices

	const int		   resultBufferMaxVertices	= refNumVertices;
	const VkDeviceSize resultBufferSizeBytes    = sizeof(deInt32) + resultBufferMaxVertices * sizeof(deUint32);
	const Buffer       resultBuffer             (vk, device, allocator, makeBufferCreateInfo(resultBufferSizeBytes, VK_BUFFER_USAGE_STORAGE_BUFFER_BIT), MemoryRequirement::HostVisible);

	{
		const Allocation& alloc = resultBuffer.getAllocation();
		deMemset(alloc.getHostPtr(), 0, static_cast<std::size_t>(resultBufferSizeBytes));
		flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), resultBufferSizeBytes);
	}

	// Color attachment

	const tcu::IVec2			  renderSize				 = tcu::IVec2(RENDER_SIZE, RENDER_SIZE);
	const VkFormat				  colorFormat				 = VK_FORMAT_R8G8B8A8_UNORM;
	const VkImageSubresourceRange colorImageSubresourceRange = makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, 1u);
	const Image					  colorAttachmentImage		 (vk, device, allocator,
															 makeImageCreateInfo(renderSize, colorFormat, VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT, 1u),
															 MemoryRequirement::Any);

	// Color output buffer: image will be copied here for verification

	const VkDeviceSize	colorBufferSizeBytes	= renderSize.x()*renderSize.y() * tcu::getPixelSize(mapVkFormat(colorFormat));
	const Buffer		colorBuffer				(vk, device, allocator, makeBufferCreateInfo(colorBufferSizeBytes, VK_BUFFER_USAGE_TRANSFER_DST_BIT), MemoryRequirement::HostVisible);

	// Descriptors

	const Unique<VkDescriptorSetLayout> descriptorSetLayout(DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT)
		.build(vk, device));

	const Unique<VkDescriptorPool> descriptorPool(DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER)
		.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u));

	const Unique<VkDescriptorSet> descriptorSet    (makeDescriptorSet(vk, device, *descriptorPool, *descriptorSetLayout));
	const VkDescriptorBufferInfo  resultBufferInfo = makeDescriptorBufferInfo(resultBuffer.get(), 0ull, resultBufferSizeBytes);

	DescriptorSetUpdateBuilder()
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &resultBufferInfo)
		.update(vk, device);

	// Pipeline

	const Unique<VkImageView>      colorAttachmentView(makeImageView(vk, device, *colorAttachmentImage, VK_IMAGE_VIEW_TYPE_2D, colorFormat, colorImageSubresourceRange));
	const Unique<VkRenderPass>     renderPass         (makeRenderPass(vk, device, colorFormat));
	const Unique<VkFramebuffer>    framebuffer        (makeFramebuffer(vk, device, *renderPass, *colorAttachmentView, renderSize.x(), renderSize.y(), 1u));
	const Unique<VkPipelineLayout> pipelineLayout     (makePipelineLayout(vk, device, *descriptorSetLayout));
	const Unique<VkCommandPool>    cmdPool            (makeCommandPool(vk, device, queueFamilyIndex));
	const Unique<VkCommandBuffer>  cmdBuffer          (allocateCommandBuffer (vk, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	const Unique<VkPipeline> pipeline(GraphicsPipelineBuilder()
		.setRenderSize                (renderSize)
		.setPatchControlPoints        (numAttributes)
		.setVertexInputSingleAttribute(vertexFormat, vertexStride)
		.setShader                    (vk, device, VK_SHADER_STAGE_VERTEX_BIT,					m_context.getBinaryCollection().get("vert"), DE_NULL)
		.setShader                    (vk, device, VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,	m_context.getBinaryCollection().get("tesc"), DE_NULL)
		.setShader                    (vk, device, VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT, m_context.getBinaryCollection().get("tese"), DE_NULL)
		.setShader                    (vk, device, VK_SHADER_STAGE_FRAGMENT_BIT,				m_context.getBinaryCollection().get("frag"), DE_NULL)
		.build                        (vk, device, *pipelineLayout, *renderPass));

	// Begin draw

	beginCommandBuffer(vk, *cmdBuffer);

	// Change color attachment image layout
	{
		const VkImageMemoryBarrier colorAttachmentLayoutBarrier = makeImageMemoryBarrier(
			(VkAccessFlags)0, VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT,
			VK_IMAGE_LAYOUT_UNDEFINED, VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
			*colorAttachmentImage, colorImageSubresourceRange);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, VK_PIPELINE_STAGE_FRAGMENT_SHADER_BIT, 0u,
			0u, DE_NULL, 0u, DE_NULL, 1u, &colorAttachmentLayoutBarrier);
	}

	{
		const VkRect2D renderArea = {
			makeOffset2D(0, 0),
			makeExtent2D(renderSize.x(), renderSize.y()),
		};
		const tcu::Vec4 clearColor(0.0f, 0.0f, 0.0f, 1.0f);

		beginRenderPass(vk, *cmdBuffer, *renderPass, *framebuffer, renderArea, clearColor);
	}

	vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipeline);
	vk.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipelineLayout, 0u, 1u, &descriptorSet.get(), 0u, DE_NULL);
	{
		const VkDeviceSize vertexBufferOffset = 0ull;
		vk.cmdBindVertexBuffers(*cmdBuffer, 0u, 1u, &vertexBuffer.get(), &vertexBufferOffset);
	}

	vk.cmdDraw(*cmdBuffer, numAttributes, 1u, 0u, 0u);
	endRenderPass(vk, *cmdBuffer);

	// Copy render result to a host-visible buffer
	{
		const VkImageMemoryBarrier colorAttachmentPreCopyBarrier = makeImageMemoryBarrier(
			VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT, VK_ACCESS_TRANSFER_READ_BIT,
			VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
			*colorAttachmentImage, colorImageSubresourceRange);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, 0u,
			0u, DE_NULL, 0u, DE_NULL, 1u, &colorAttachmentPreCopyBarrier);
	}
	{
		const VkBufferImageCopy copyRegion = makeBufferImageCopy(makeExtent3D(renderSize.x(), renderSize.y(), 1), makeImageSubresourceLayers(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 0u, 1u));
		vk.cmdCopyImageToBuffer(*cmdBuffer, *colorAttachmentImage, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, *colorBuffer, 1u, &copyRegion);
	}
	{
		const VkBufferMemoryBarrier postCopyBarrier = makeBufferMemoryBarrier(
			VK_ACCESS_TRANSFER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT, *colorBuffer, 0ull, colorBufferSizeBytes);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u,
			0u, DE_NULL, 1u, &postCopyBarrier, 0u, DE_NULL);
	}

	endCommandBuffer(vk, *cmdBuffer);
	submitCommandsAndWait(vk, device, queue, *cmdBuffer);

	// Verification

	bool isImageCompareOK = false;
	{
		const Allocation& colorBufferAlloc = colorBuffer.getAllocation();
		invalidateMappedMemoryRange(vk, device, colorBufferAlloc.getMemory(), colorBufferAlloc.getOffset(), colorBufferSizeBytes);

		// Load reference image
		tcu::TextureLevel referenceImage;
		tcu::ImageIO::loadPNG(referenceImage, m_context.getTestContext().getArchive(), m_caseDef.referenceImagePath.c_str());

		// Verify case result
		const tcu::ConstPixelBufferAccess resultImageAccess(mapVkFormat(colorFormat), renderSize.x(), renderSize.y(), 1, colorBufferAlloc.getHostPtr());
		isImageCompareOK = tcu::fuzzyCompare(m_context.getTestContext().getLog(), "ImageComparison", "Image Comparison",
											 referenceImage.getAccess(), resultImageAccess, 0.02f, tcu::COMPARE_LOG_RESULT);
	}
	{
		const Allocation& resultAlloc = resultBuffer.getAllocation();
		invalidateMappedMemoryRange(vk, device, resultAlloc.getMemory(), resultAlloc.getOffset(), resultBufferSizeBytes);

		const deInt32			numVertices = *static_cast<deInt32*>(resultAlloc.getHostPtr());
		const deUint32* const	vertices    = reinterpret_cast<deUint32*>(static_cast<deUint8*>(resultAlloc.getHostPtr()) + sizeof(deInt32));

		// If this fails then we didn't read all vertices from shader and test must be changed to allow more.
		DE_ASSERT(numVertices <= refNumVertices);

		if (numVertices < refNumUniqueVertices)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "Failure: got " << numVertices << " vertices, but expected at least " << refNumUniqueVertices << tcu::TestLog::EndMessage;

			return tcu::TestStatus::fail("Wrong number of vertices");
		}
		else
		{
			tcu::TestLog&	log					= m_context.getTestContext().getLog();
			const int		topLevelArraySize	= (m_caseDef.ioType == IO_TYPE_PER_PATCH			? 1
												: m_caseDef.ioType == IO_TYPE_PER_PATCH_ARRAY		? NUM_PER_PATCH_ARRAY_ELEMS
												: m_caseDef.ioType == IO_TYPE_PER_PATCH_BLOCK		? 1
												: m_caseDef.ioType == IO_TYPE_PER_PATCH_BLOCK_ARRAY	? NUM_PER_PATCH_BLOCKS
												: NUM_OUTPUT_VERTICES);
			const deUint32	numTEInputs			= numBasicSubobjectsInElementType(m_tesInputs) * topLevelArraySize;

			for (int vertexNdx = 0; vertexNdx < numVertices; ++vertexNdx)
				if (vertices[vertexNdx] > numTEInputs)
				{
					log << tcu::TestLog::Message
						<< "Failure: out_te_firstFailedInputIndex has value " << vertices[vertexNdx]
						<< ", but should be in range [0, " << numTEInputs << "]" << tcu::TestLog::EndMessage;

					return tcu::TestStatus::fail("Invalid values returned from shader");
				}
				else if (vertices[vertexNdx] != numTEInputs)
				{
					log << tcu::TestLog::Message << "Failure: in tessellation evaluation shader, check for input "
						<< basicSubobjectAtIndex(vertices[vertexNdx], m_tesInputs, topLevelArraySize) << " failed" << tcu::TestLog::EndMessage;

					return tcu::TestStatus::fail("Invalid input value in tessellation evaluation shader");
				}
		}
	}
	return (isImageCompareOK ? tcu::TestStatus::pass("OK") : tcu::TestStatus::fail("Image comparison failed"));
}